

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O2

cell * references::scheme::proc_div(cell *__return_storage_ptr__,cells *c)

{
  pointer pcVar1;
  pointer pcVar2;
  scheme *this;
  long lVar3;
  long extraout_RDX;
  long n;
  string local_40;
  
  pcVar1 = (c->
           super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>).
           _M_impl.super__Vector_impl_data._M_start;
  this = (scheme *)atol((pcVar1->val)._M_dataplus._M_p);
  pcVar2 = (c->
           super__Vector_base<references::scheme::cell,_std::allocator<references::scheme::cell>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  n = extraout_RDX;
  while (pcVar1 + 1 != pcVar2) {
    lVar3 = atol(pcVar1[1].val._M_dataplus._M_p);
    n = (long)this % lVar3;
    this = (scheme *)((long)this / lVar3);
    pcVar1 = pcVar1 + 1;
  }
  str_abi_cxx11_(&local_40,this,n);
  cell::cell(__return_storage_ptr__,Number,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

cell proc_div(const cells & c)
{
	long n(atol(c[0].val.c_str()));
	for (cellit i = c.begin() + 1; i != c.end(); ++i) n /= atol(i->val.c_str());
	return cell(Number, str(n));
}